

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_tree_renderer.cpp
# Opt level: O2

yyjson_mut_val * duckdb::RenderRecursive(yyjson_mut_doc *doc,RenderTree *tree,idx_t x,idx_t y)

{
  yyjson_val_pool *pyVar1;
  yyjson_alc *alc;
  pointer pCVar2;
  char *pcVar3;
  long lVar4;
  pointer ppVar5;
  bool bVar6;
  RenderTreeNode *pRVar7;
  yyjson_mut_val *pyVar8;
  size_t sVar9;
  ulong uVar10;
  yyjson_mut_val *pyVar11;
  yyjson_mut_val *pyVar12;
  pointer ppVar13;
  char *pcVar14;
  pointer pbVar15;
  Coordinate *child_pos;
  pointer pCVar16;
  yyjson_mut_val *local_b0;
  yyjson_mut_val *local_a8;
  allocator local_91;
  yyjson_str_pool *local_90;
  pointer local_88;
  pointer local_80;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  splits;
  optional_ptr<duckdb::RenderTreeNode,_true> node_p;
  string local_50;
  
  node_p = RenderTree::GetNode(tree,x,y);
  pRVar7 = optional_ptr<duckdb::RenderTreeNode,_true>::operator*(&node_p);
  if (doc == (yyjson_mut_doc *)0x0) {
    local_b0 = (yyjson_mut_val *)0x0;
LAB_008d92f5:
    pyVar12 = (yyjson_mut_val *)0x0;
  }
  else {
    pyVar1 = &doc->val_pool;
    local_b0 = (doc->val_pool).cur;
    if ((doc->val_pool).end == local_b0) {
      bVar6 = duckdb_yyjson::unsafe_yyjson_val_pool_grow(pyVar1,&doc->alc,1);
      local_b0 = (doc->val_pool).cur;
      pyVar12 = local_b0;
      if (bVar6) goto LAB_008d8a45;
LAB_008d933e:
      local_b0 = (yyjson_mut_val *)0x0;
    }
    else {
LAB_008d8a45:
      pyVar12 = local_b0 + 1;
      pyVar1->cur = pyVar12;
      if (local_b0 == (yyjson_mut_val *)0x0) goto LAB_008d933e;
      local_b0->tag = 7;
    }
    if ((doc->val_pool).end == pyVar12) {
      bVar6 = duckdb_yyjson::unsafe_yyjson_val_pool_grow(pyVar1,&doc->alc,1);
      if (!bVar6) goto LAB_008d92f5;
      pyVar12 = pyVar1->cur;
    }
    pyVar1->cur = pyVar12 + 1;
    if (pyVar12 == (yyjson_mut_val *)0x0) goto LAB_008d92f5;
    pyVar12->tag = 6;
  }
  pCVar2 = (pRVar7->child_positions).
           super_vector<duckdb::RenderTreeNode::Coordinate,_std::allocator<duckdb::RenderTreeNode::Coordinate>_>
           .
           super__Vector_base<duckdb::RenderTreeNode::Coordinate,_std::allocator<duckdb::RenderTreeNode::Coordinate>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (pCVar16 = (pRVar7->child_positions).
                 super_vector<duckdb::RenderTreeNode::Coordinate,_std::allocator<duckdb::RenderTreeNode::Coordinate>_>
                 .
                 super__Vector_base<duckdb::RenderTreeNode::Coordinate,_std::allocator<duckdb::RenderTreeNode::Coordinate>_>
                 ._M_impl.super__Vector_impl_data._M_start; pCVar16 != pCVar2; pCVar16 = pCVar16 + 1
      ) {
    pyVar8 = RenderRecursive(doc,tree,pCVar16->x,pCVar16->y);
    if (((pyVar12 != (yyjson_mut_val *)0x0) && (pyVar8 != (yyjson_mut_val *)0x0)) &&
       (uVar10 = pyVar12->tag, ((uint)uVar10 & 7) == 6)) {
      pyVar12->tag = (uVar10 & 0xfffffffffffffffe) + 0x100;
      pyVar11 = pyVar8;
      if (0xff < uVar10) {
        pyVar11 = *(yyjson_mut_val **)((pyVar12->uni).u64 + 0x10);
        *(yyjson_mut_val **)((pyVar12->uni).u64 + 0x10) = pyVar8;
      }
      pyVar8->next = pyVar11;
      (pyVar12->uni).str = (char *)pyVar8;
    }
  }
  pcVar3 = (pRVar7->name)._M_dataplus._M_p;
  if (pcVar3 == (char *)0x0) {
LAB_008d8bfa:
    if (pyVar12 == (yyjson_mut_val *)0x0) {
      if (doc != (yyjson_mut_doc *)0x0) goto LAB_008d8cb8;
    }
    else if (doc != (yyjson_mut_doc *)0x0) {
      if ((local_b0 != (yyjson_mut_val *)0x0) && ((~(uint)local_b0->tag & 7) == 0)) {
        pyVar1 = &doc->val_pool;
        pyVar8 = (doc->val_pool).cur;
        if ((ulong)(((long)(doc->val_pool).end - (long)pyVar8) / 0x18) < 2) {
          bVar6 = duckdb_yyjson::unsafe_yyjson_val_pool_grow(pyVar1,&doc->alc,2);
          if (!bVar6) goto LAB_008d8cb8;
          pyVar8 = pyVar1->cur;
        }
        pyVar1->cur = pyVar8 + 2;
        if (pyVar8 != (yyjson_mut_val *)0x0) {
          uVar10 = local_b0->tag;
          pyVar8->tag = 0x80d;
          (pyVar8->uni).f64 = (double)"children";
          pyVar11 = pyVar8;
          if (0xff < uVar10) {
            lVar4 = *(long *)((local_b0->uni).u64 + 0x10);
            pyVar11 = *(yyjson_mut_val **)(lVar4 + 0x10);
            *(yyjson_mut_val **)(lVar4 + 0x10) = pyVar8;
          }
          pyVar12->next = pyVar11;
          pyVar8->next = pyVar12;
          (local_b0->uni).u64 = (uint64_t)pyVar8;
          local_b0->tag = (uVar10 & 0xffffffffffffff00) + (ulong)(byte)local_b0->tag + 0x100;
        }
      }
LAB_008d8cb8:
      pyVar1 = &doc->val_pool;
      local_a8 = (doc->val_pool).cur;
      if ((doc->val_pool).end == local_a8) {
        bVar6 = duckdb_yyjson::unsafe_yyjson_val_pool_grow(pyVar1,&doc->alc,1);
        if (bVar6) {
          local_a8 = pyVar1->cur;
          goto LAB_008d8cd2;
        }
      }
      else {
LAB_008d8cd2:
        pyVar1->cur = local_a8 + 1;
        if (local_a8 != (yyjson_mut_val *)0x0) {
          local_a8->tag = 7;
          goto LAB_008d8cee;
        }
      }
      local_a8 = (yyjson_mut_val *)0x0;
      goto LAB_008d8cee;
    }
  }
  else if (doc != (yyjson_mut_doc *)0x0) {
    if ((local_b0 != (yyjson_mut_val *)0x0) && ((~(uint)local_b0->tag & 7) == 0)) {
      pyVar1 = &doc->val_pool;
      pyVar8 = (doc->val_pool).cur;
      if ((ulong)(((long)(doc->val_pool).end - (long)pyVar8) / 0x18) < 2) {
        bVar6 = duckdb_yyjson::unsafe_yyjson_val_pool_grow(pyVar1,&doc->alc,2);
        if (!bVar6) goto LAB_008d8bfa;
        pyVar8 = pyVar1->cur;
      }
      pyVar1->cur = pyVar8 + 2;
      if (pyVar8 != (yyjson_mut_val *)0x0) {
        uVar10 = local_b0->tag;
        local_80 = (pointer)(pyVar8 + 1);
        pyVar8->tag = 0x40d;
        (pyVar8->uni).str = "name";
        sVar9 = strlen(pcVar3);
        pyVar8[1].tag = sVar9 << 8 | 5;
        pyVar8[1].uni.str = pcVar3;
        pyVar11 = pyVar8;
        if (0xff < uVar10) {
          lVar4 = *(long *)((local_b0->uni).u64 + 0x10);
          pyVar11 = *(yyjson_mut_val **)(lVar4 + 0x10);
          *(yyjson_mut_val **)(lVar4 + 0x10) = pyVar8;
        }
        pyVar8[1].next = pyVar11;
        pyVar8->next = (yyjson_mut_val *)local_80;
        (local_b0->uni).u64 = (uint64_t)pyVar8;
        local_b0->tag = (ulong)(byte)local_b0->tag + (uVar10 & 0xffffffffffffff00) + 0x100;
      }
    }
    goto LAB_008d8bfa;
  }
  local_a8 = (yyjson_mut_val *)0x0;
LAB_008d8cee:
  ppVar13 = (pRVar7->extra_text).map.
            super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            .
            super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  ppVar5 = (pRVar7->extra_text).map.
           super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           .
           super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  pyVar1 = &doc->val_pool;
  alc = &doc->alc;
  local_90 = &doc->str_pool;
  do {
    if (ppVar13 == ppVar5) {
      if ((((doc != (yyjson_mut_doc *)0x0) && (local_b0 != (yyjson_mut_val *)0x0)) &&
          (local_a8 != (yyjson_mut_val *)0x0)) && ((~(uint)local_b0->tag & 7) == 0)) {
        pyVar12 = (doc->val_pool).cur;
        if ((ulong)(((long)(doc->val_pool).end - (long)pyVar12) / 0x18) < 2) {
          bVar6 = duckdb_yyjson::unsafe_yyjson_val_pool_grow(pyVar1,alc,2);
          if (!bVar6) {
            return local_b0;
          }
          pyVar12 = pyVar1->cur;
        }
        pyVar1->cur = pyVar12 + 2;
        if (pyVar12 != (yyjson_mut_val *)0x0) {
          uVar10 = local_b0->tag;
          pyVar12->tag = 0xa0d;
          (pyVar12->uni).f64 = (double)"extra_info";
          pyVar8 = pyVar12;
          if (0xff < uVar10) {
            lVar4 = *(long *)((local_b0->uni).u64 + 0x10);
            pyVar8 = *(yyjson_mut_val **)(lVar4 + 0x10);
            *(yyjson_mut_val **)(lVar4 + 0x10) = pyVar12;
          }
          local_a8->next = pyVar8;
          pyVar12->next = local_a8;
          (local_b0->uni).u64 = (uint64_t)pyVar12;
          local_b0->tag = (uVar10 & 0xffffffffffffff00) + (ulong)(byte)local_b0->tag + 0x100;
        }
      }
      return local_b0;
    }
    ::std::__cxx11::string::string((string *)&local_50,anon_var_dwarf_4b71d2e + 8,&local_91);
    StringUtil::Split(&splits,&ppVar13->second,&local_50);
    ::std::__cxx11::string::~string((string *)&local_50);
    local_88 = ppVar13;
    if ((ulong)((long)splits.
                      super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      .
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
               (long)splits.
                     super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     .
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start) < 0x21) {
      if (((doc != (yyjson_mut_doc *)0x0) && (local_a8 != (yyjson_mut_val *)0x0)) &&
         ((pcVar3 = (ppVar13->second)._M_dataplus._M_p, pcVar3 != (char *)0x0 &&
          (((~(uint)local_a8->tag & 7) == 0 &&
           (pcVar14 = (ppVar13->first)._M_dataplus._M_p, pcVar14 != (char *)0x0)))))) {
        pyVar12 = (doc->val_pool).cur;
        if ((ulong)(((long)(doc->val_pool).end - (long)pyVar12) / 0x18) < 2) {
          bVar6 = duckdb_yyjson::unsafe_yyjson_val_pool_grow(pyVar1,alc,2);
          if (!bVar6) goto LAB_008d915c;
          pyVar12 = pyVar1->cur;
        }
        pyVar1->cur = pyVar12 + 2;
        if (pyVar12 != (yyjson_mut_val *)0x0) {
          uVar10 = local_a8->tag;
          pyVar12->tag = 5;
          sVar9 = strlen(pcVar14);
          pyVar12->tag = sVar9 << 8 | 5;
          (pyVar12->uni).str = pcVar14;
          sVar9 = strlen(pcVar3);
          pcVar14 = (doc->str_pool).cur;
          if (sVar9 < (ulong)((long)(doc->str_pool).end - (long)pcVar14)) {
LAB_008d8ff5:
            local_90->cur = pcVar14 + sVar9 + 1;
            if (pcVar14 != (char *)0x0) {
              switchD_00916250::default(pcVar14,pcVar3,sVar9);
              pcVar14[sVar9] = '\0';
              pyVar12[1].uni.ptr = pcVar14;
              pyVar12[1].tag = sVar9 << 8 | 5;
              pyVar8 = pyVar12;
              if (0xff < uVar10) {
                lVar4 = *(long *)((local_a8->uni).u64 + 0x10);
                pyVar8 = *(yyjson_mut_val **)(lVar4 + 0x10);
                *(yyjson_mut_val **)(lVar4 + 0x10) = pyVar12;
              }
              pyVar12[1].next = pyVar8;
              pyVar12->next = pyVar12 + 1;
              (local_a8->uni).str = (char *)pyVar12;
              local_a8->tag = (ulong)(byte)local_a8->tag + (uVar10 & 0xffffffffffffff00) + 0x100;
              goto LAB_008d915c;
            }
          }
          else {
            bVar6 = duckdb_yyjson::unsafe_yyjson_str_pool_grow(local_90,alc,sVar9 + 1);
            if (bVar6) {
              pcVar14 = local_90->cur;
              goto LAB_008d8ff5;
            }
          }
          pyVar12[1].uni.u64 = 0;
        }
      }
    }
    else {
      if (doc == (yyjson_mut_doc *)0x0) {
LAB_008d919d:
        pyVar12 = (yyjson_mut_val *)0x0;
      }
      else {
        pyVar12 = (doc->val_pool).cur;
        if ((doc->val_pool).end == pyVar12) {
          bVar6 = duckdb_yyjson::unsafe_yyjson_val_pool_grow(pyVar1,alc,1);
          if (!bVar6) goto LAB_008d919d;
          pyVar12 = pyVar1->cur;
        }
        pyVar1->cur = pyVar12 + 1;
        if (pyVar12 == (yyjson_mut_val *)0x0) goto LAB_008d919d;
        pyVar12->tag = 6;
      }
      local_80 = splits.
                 super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 .
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      for (pbVar15 = splits.
                     super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     .
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start; pbVar15 != local_80;
          pbVar15 = pbVar15 + 1) {
        if ((pyVar12 != (yyjson_mut_val *)0x0 && doc != (yyjson_mut_doc *)0x0) &&
           (uVar10 = pyVar12->tag, ((uint)uVar10 & 7) == 6)) {
          pcVar3 = (pbVar15->_M_dataplus)._M_p;
          if (pcVar3 == (char *)0x0) {
            pyVar8 = (yyjson_mut_val *)0x0;
          }
          else {
            sVar9 = strlen(pcVar3);
            pyVar8 = (doc->val_pool).cur;
            if ((doc->val_pool).end == pyVar8) {
              bVar6 = duckdb_yyjson::unsafe_yyjson_val_pool_grow(pyVar1,alc,1);
              if (bVar6) {
                pyVar8 = pyVar1->cur;
                goto LAB_008d8e15;
              }
              pyVar8 = (yyjson_mut_val *)0x0;
            }
            else {
LAB_008d8e15:
              pyVar1->cur = pyVar8 + 1;
            }
            pcVar14 = (doc->str_pool).cur;
            if (sVar9 < (ulong)((long)(doc->str_pool).end - (long)pcVar14)) {
LAB_008d8e38:
              local_90->cur = pcVar14 + sVar9 + 1;
              if (pcVar14 != (char *)0x0) {
                switchD_00916250::default(pcVar14,pcVar3,sVar9);
                pcVar14[sVar9] = '\0';
                if (pyVar8 != (yyjson_mut_val *)0x0) {
                  pyVar8->tag = sVar9 << 8 | 5;
                  (pyVar8->uni).ptr = pcVar14;
                  goto LAB_008d8e80;
                }
              }
              pyVar8 = (yyjson_mut_val *)0x0;
            }
            else {
              bVar6 = duckdb_yyjson::unsafe_yyjson_str_pool_grow(local_90,alc,sVar9 + 1);
              if (bVar6) {
                pcVar14 = local_90->cur;
                goto LAB_008d8e38;
              }
              pyVar8 = (yyjson_mut_val *)0x0;
            }
LAB_008d8e80:
            uVar10 = pyVar12->tag;
          }
          if ((pyVar8 != (yyjson_mut_val *)0x0) && (((uint)uVar10 & 7) == 6)) {
            pyVar12->tag = (uVar10 & 0xfffffffffffffffe) + 0x100;
            pyVar11 = pyVar8;
            if (0xff < uVar10) {
              pyVar11 = *(yyjson_mut_val **)((pyVar12->uni).u64 + 0x10);
              *(yyjson_mut_val **)((pyVar12->uni).u64 + 0x10) = pyVar8;
            }
            pyVar8->next = pyVar11;
            (pyVar12->uni).u64 = (uint64_t)pyVar8;
          }
        }
      }
      if ((((doc != (yyjson_mut_doc *)0x0) && (local_a8 != (yyjson_mut_val *)0x0)) &&
          (pyVar12 != (yyjson_mut_val *)0x0)) &&
         (((~(uint)local_a8->tag & 7) == 0 &&
          (pcVar3 = (local_88->first)._M_dataplus._M_p, pcVar3 != (char *)0x0)))) {
        pyVar8 = (doc->val_pool).cur;
        if ((ulong)(((long)(doc->val_pool).end - (long)pyVar8) / 0x18) < 2) {
          bVar6 = duckdb_yyjson::unsafe_yyjson_val_pool_grow(pyVar1,alc,2);
          if (!bVar6) goto LAB_008d915c;
          pyVar8 = pyVar1->cur;
        }
        pyVar1->cur = pyVar8 + 2;
        if (pyVar8 != (yyjson_mut_val *)0x0) {
          uVar10 = local_a8->tag;
          pyVar8->tag = 5;
          sVar9 = strlen(pcVar3);
          pyVar8->tag = sVar9 << 8 | 5;
          (pyVar8->uni).str = pcVar3;
          pyVar11 = pyVar8;
          if (0xff < uVar10) {
            lVar4 = *(long *)((local_a8->uni).u64 + 0x10);
            pyVar11 = *(yyjson_mut_val **)(lVar4 + 0x10);
            *(yyjson_mut_val **)(lVar4 + 0x10) = pyVar8;
          }
          pyVar12->next = pyVar11;
          pyVar8->next = pyVar12;
          (local_a8->uni).str = (char *)pyVar8;
          local_a8->tag = (ulong)(byte)local_a8->tag + (uVar10 & 0xffffffffffffff00) + 0x100;
        }
      }
    }
LAB_008d915c:
    ::std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&splits);
    ppVar13 = local_88 + 1;
  } while( true );
}

Assistant:

static yyjson_mut_val *RenderRecursive(yyjson_mut_doc *doc, RenderTree &tree, idx_t x, idx_t y) {
	auto node_p = tree.GetNode(x, y);
	D_ASSERT(node_p);
	auto &node = *node_p;

	auto object = yyjson_mut_obj(doc);
	auto children = yyjson_mut_arr(doc);
	for (auto &child_pos : node.child_positions) {
		auto child_object = RenderRecursive(doc, tree, child_pos.x, child_pos.y);
		yyjson_mut_arr_append(children, child_object);
	}
	yyjson_mut_obj_add_str(doc, object, "name", node.name.c_str());
	yyjson_mut_obj_add_val(doc, object, "children", children);
	auto extra_info = yyjson_mut_obj(doc);
	for (auto &it : node.extra_text) {
		auto &key = it.first;
		auto &value = it.second;
		auto splits = StringUtil::Split(value, "\n");
		if (splits.size() > 1) {
			auto list_items = yyjson_mut_arr(doc);
			for (auto &split : splits) {
				yyjson_mut_arr_add_strcpy(doc, list_items, split.c_str());
			}
			yyjson_mut_obj_add_val(doc, extra_info, key.c_str(), list_items);
		} else {
			yyjson_mut_obj_add_strcpy(doc, extra_info, key.c_str(), value.c_str());
		}
	}
	yyjson_mut_obj_add_val(doc, object, "extra_info", extra_info);
	return object;
}